

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SnippetFunction(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                        sqlite3_value **apVal)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *z;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint iCol;
  int local_144;
  int nDocsize;
  int nColSize;
  int local_138;
  int nScore;
  int io;
  int nInst;
  Fts5ExtensionApi *local_128;
  uint local_11c;
  ulong local_118;
  ulong local_110;
  i64 local_108;
  uchar *local_100;
  int iAdj;
  int ic;
  int nDoc;
  Fts5SFinder sFinder;
  HighlightContext ctx;
  int ip;
  
  local_144 = 0;
  nInst = 0;
  nColSize = 0;
  if (nVal != 5) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"wrong number of arguments to function snippet()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  local_11c = (*pApi->xColumnCount)(pFts);
  ctx.iter.pApi = (Fts5ExtensionApi *)0x0;
  ctx.iter.pFts = (Fts5Context *)0x0;
  ctx.iter.iCol = 0;
  ctx.iter.iInst = 0;
  ctx.iter.nInst = 0;
  ctx.iter.iStart = 0;
  ctx.iter.iEnd = 0;
  ctx.iter._36_4_ = 0;
  ctx.iPos = 0;
  ctx.iRangeStart = 0;
  ctx.iRangeEnd = 0;
  ctx._52_4_ = 0;
  ctx.zOpen = (char *)0x0;
  ctx.zClose = (char *)0x0;
  ctx.zIn = (char *)0x0;
  ctx.nIn = 0;
  ctx.iOff = 0;
  ctx.zOut = (char *)0x0;
  uVar7 = sqlite3VdbeIntValue(*apVal);
  ctx.zOpen = (char *)sqlite3ValueText(apVal[1],'\x01');
  if (ctx.zOpen == (char *)0x0) {
    ctx.zOpen = "";
  }
  ctx.zClose = (char *)sqlite3ValueText(apVal[2],'\x01');
  if (ctx.zClose == (char *)0x0) {
    ctx.zClose = "";
  }
  z = (char *)sqlite3ValueText(apVal[3],'\x01');
  if (z == (char *)0x0) {
    z = "";
  }
  local_108 = sqlite3VdbeIntValue(apVal[4]);
  uVar11 = (uint)uVar7;
  uVar10 = 0;
  if (0 < (int)uVar11) {
    uVar10 = uVar7 & 0xffffffff;
  }
  uVar9 = (uint)uVar10;
  iVar5 = (*pApi->xPhraseCount)(pFts);
  local_100 = (uchar *)sqlite3_malloc(iVar5);
  if (local_100 == (uchar *)0x0) {
    local_144 = 7;
  }
  if (local_144 == 0) {
    local_144 = (*pApi->xInstCount)(pFts,&nInst);
  }
  sFinder.aFirst = (int *)0x0;
  sFinder.zDoc = (char *)0x0;
  sFinder.iPos = 0;
  sFinder.nFirstAlloc = 0;
  sFinder.nFirst = 0;
  sFinder._12_4_ = 0;
  iVar6 = local_144;
  if ((int)local_11c < 1) {
    uVar7 = 0;
  }
  else {
    iCol = 0;
    local_138 = 0;
    uVar7 = 0;
    do {
      if ((int)uVar11 < 0 || iCol == uVar11) {
        bVar2 = false;
        sFinder._0_8_ = sFinder._0_8_ & 0xffffffff00000000;
        sFinder._8_8_ = sFinder._8_8_ & 0xffffffff00000000;
        iVar6 = (*pApi->xColumnText)(pFts,iCol,&sFinder.zDoc,&nDoc);
        if (iVar6 == 0) {
          iVar6 = (*pApi->xTokenize)(pFts,sFinder.zDoc,nDoc,&sFinder,fts5SentenceFinderCb);
          if ((iVar6 == 0) && (iVar6 = (*pApi->xColumnSize)(pFts,iCol,&nDocsize), iVar6 == 0)) {
            bVar2 = true;
            if (0 < nInst) {
              iVar12 = 0;
              local_128 = pApi;
              local_118 = uVar7;
              do {
                iVar6 = (*pApi->xInst)(pFts,iVar12,&ip,&ic,&io);
                puVar4 = local_100;
                if (ic == iCol) {
                  if (nDocsize < io) {
                    iVar6 = 0x10b;
                  }
                  if (iVar6 == 0) {
                    local_110 = CONCAT44(local_110._4_4_,(int)uVar10);
                    memset(local_100,0,(long)iVar5);
                    iVar6 = fts5SnippetScore(pApi,pFts,nDocsize,puVar4,iCol,io,(int)local_108,
                                             &nScore,&iAdj);
                    puVar4 = local_100;
                    if (iVar6 == 0) {
                      uVar10 = local_110 & 0xffffffff;
                      if (local_138 < nScore) {
                        local_118 = (ulong)(uint)iAdj;
                        nColSize = nDocsize;
                        local_138 = nScore;
                        uVar10 = (ulong)iCol;
                      }
                    }
                    else {
                      uVar10 = local_110 & 0xffffffff;
                    }
                    pApi = local_128;
                    if (((iVar6 == 0) && (sFinder.nFirst != 0)) && ((int)local_108 < nDocsize)) {
                      iVar8 = sFinder.nFirst;
                      if (sFinder.nFirst < 2) {
                        iVar8 = 1;
                      }
                      uVar9 = iVar8 - 1;
                      uVar7 = 0;
                      do {
                        if (uVar9 == uVar7) goto LAB_001af983;
                        uVar1 = uVar7 + 1;
                        lVar3 = uVar7 + 1;
                        uVar7 = uVar1;
                      } while (sFinder.aFirst[lVar3] <= io);
                      uVar9 = (int)uVar1 - 1;
LAB_001af983:
                      uVar7 = (ulong)uVar9;
                      if (sFinder.aFirst[uVar7] < io) {
                        local_110 = uVar7;
                        memset(local_100,0,(long)iVar5);
                        iVar6 = fts5SnippetScore(local_128,pFts,nDocsize,puVar4,iCol,
                                                 sFinder.aFirst[uVar7],(int)local_108,&nScore,
                                                 (int *)0x0);
                        iVar8 = 100;
                        if (sFinder.aFirst[local_110] == 0) {
                          iVar8 = 0x78;
                        }
                        nScore = iVar8 + nScore;
                        pApi = local_128;
                        if ((iVar6 == 0) && (local_138 < nScore)) {
                          nColSize = nDocsize;
                          uVar10 = (ulong)iCol;
                          local_138 = nScore;
                          local_118 = (ulong)(uint)sFinder.aFirst[local_110];
                        }
                      }
                    }
                  }
                }
                uVar7 = local_118;
              } while ((iVar6 == 0) && (iVar12 = iVar12 + 1, iVar12 < nInst));
            }
          }
          else {
            bVar2 = false;
          }
        }
        uVar9 = (uint)uVar10;
        if (!bVar2) break;
      }
      uVar9 = (uint)uVar10;
      iCol = iCol + 1;
    } while (iCol != local_11c);
  }
  local_144 = iVar6;
  if (iVar6 == 0) {
    local_144 = (*pApi->xColumnText)(pFts,uVar9,&ctx.zIn,&ctx.nIn);
  }
  if (nColSize == 0 && local_144 == 0) {
    local_144 = (*pApi->xColumnSize)(pFts,uVar9,&nColSize);
  }
  if (ctx.zIn != (char *)0x0) {
    iVar5 = local_144;
    if (local_144 == 0) {
      ctx.iter.nInst = 0;
      ctx.iter.iStart = 0;
      ctx.iter.iEnd = 0;
      ctx.iter._36_4_ = 0;
      ctx.iter.iInst = 0;
      ctx.iter.iCol = uVar9;
      ctx.iter.pApi = pApi;
      ctx.iter.pFts = pFts;
      iVar5 = (*pApi->xInstCount)(pFts,&ctx.iter.nInst);
      if (iVar5 == 0) {
        iVar5 = fts5CInstIterNext(&ctx.iter);
      }
    }
    local_144 = iVar5;
    iVar5 = (int)uVar7;
    ctx.iRangeStart = iVar5;
    ctx.iRangeEnd = (int)local_108 + iVar5 + -1;
    if (0 < iVar5) {
      fts5HighlightAppend(&local_144,&ctx,z,-1);
    }
    iVar6 = local_144;
    if (-1 < (long)ctx.iter._24_8_) {
      do {
        if ((iVar5 <= ctx.iter.iStart) || (iVar6 != 0)) break;
        iVar6 = fts5CInstIterNext(&ctx.iter);
      } while (-1 < (long)ctx.iter._24_8_);
    }
    local_144 = iVar6;
    if (iVar6 == 0) {
      local_144 = (*pApi->xTokenize)(pFts,ctx.zIn,ctx.nIn,&ctx,fts5HighlightCb);
    }
    if (ctx.iRangeEnd < nColSize + -1) {
      iVar5 = -1;
    }
    else {
      iVar5 = ctx.nIn - ctx.iOff;
      z = ctx.zIn + ctx.iOff;
    }
    fts5HighlightAppend(&local_144,&ctx,z,iVar5);
  }
  if (local_144 == 0) {
    setResultStrOrError(pCtx,ctx.zOut,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(pCtx,local_144);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(local_100);
  sqlite3_free(sFinder.aFirst);
  return;
}

Assistant:

static void fts5SnippetFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc = SQLITE_OK;             /* Return code */
  int iCol;                       /* 1st argument to snippet() */
  const char *zEllips;            /* 4th argument to snippet() */
  int nToken;                     /* 5th argument to snippet() */
  int nInst = 0;                  /* Number of instance matches this row */
  int i;                          /* Used to iterate through instances */
  int nPhrase;                    /* Number of phrases in query */
  unsigned char *aSeen;           /* Array of "seen instance" flags */
  int iBestCol;                   /* Column containing best snippet */
  int iBestStart = 0;             /* First token of best snippet */
  int nBestScore = 0;             /* Score of best snippet */
  int nColSize = 0;               /* Total size of iBestCol in tokens */
  Fts5SFinder sFinder;            /* Used to find the beginnings of sentences */
  int nCol;

  if( nVal!=5 ){
    const char *zErr = "wrong number of arguments to function snippet()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  nCol = pApi->xColumnCount(pFts);
  memset(&ctx, 0, sizeof(HighlightContext));
  iCol = sqlite3_value_int(apVal[0]);
  ctx.zOpen = fts5ValueToText(apVal[1]);
  ctx.zClose = fts5ValueToText(apVal[2]);
  zEllips = fts5ValueToText(apVal[3]);
  nToken = sqlite3_value_int(apVal[4]);

  iBestCol = (iCol>=0 ? iCol : 0);
  nPhrase = pApi->xPhraseCount(pFts);
  aSeen = sqlite3_malloc(nPhrase);
  if( aSeen==0 ){
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    rc = pApi->xInstCount(pFts, &nInst);
  }

  memset(&sFinder, 0, sizeof(Fts5SFinder));
  for(i=0; i<nCol; i++){
    if( iCol<0 || iCol==i ){
      int nDoc;
      int nDocsize;
      int ii;
      sFinder.iPos = 0;
      sFinder.nFirst = 0;
      rc = pApi->xColumnText(pFts, i, &sFinder.zDoc, &nDoc);
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xTokenize(pFts, 
          sFinder.zDoc, nDoc, (void*)&sFinder,fts5SentenceFinderCb
      );
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xColumnSize(pFts, i, &nDocsize);
      if( rc!=SQLITE_OK ) break;

      for(ii=0; rc==SQLITE_OK && ii<nInst; ii++){
        int ip, ic, io;
        int iAdj;
        int nScore;
        int jj;

        rc = pApi->xInst(pFts, ii, &ip, &ic, &io);
        if( ic!=i ) continue;
        if( io>nDocsize ) rc = FTS5_CORRUPT;
        if( rc!=SQLITE_OK ) continue;
        memset(aSeen, 0, nPhrase);
        rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i,
            io, nToken, &nScore, &iAdj
        );
        if( rc==SQLITE_OK && nScore>nBestScore ){
          nBestScore = nScore;
          iBestCol = i;
          iBestStart = iAdj;
          nColSize = nDocsize;
        }

        if( rc==SQLITE_OK && sFinder.nFirst && nDocsize>nToken ){
          for(jj=0; jj<(sFinder.nFirst-1); jj++){
            if( sFinder.aFirst[jj+1]>io ) break;
          }

          if( sFinder.aFirst[jj]<io ){
            memset(aSeen, 0, nPhrase);
            rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i, 
              sFinder.aFirst[jj], nToken, &nScore, 0
            );

            nScore += (sFinder.aFirst[jj]==0 ? 120 : 100);
            if( rc==SQLITE_OK && nScore>nBestScore ){
              nBestScore = nScore;
              iBestCol = i;
              iBestStart = sFinder.aFirst[jj];
              nColSize = nDocsize;
            }
          }
        }
      }
    }
  }

  if( rc==SQLITE_OK ){
    rc = pApi->xColumnText(pFts, iBestCol, &ctx.zIn, &ctx.nIn);
  }
  if( rc==SQLITE_OK && nColSize==0 ){
    rc = pApi->xColumnSize(pFts, iBestCol, &nColSize);
  }
  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iBestCol, &ctx.iter);
    }

    ctx.iRangeStart = iBestStart;
    ctx.iRangeEnd = iBestStart + nToken - 1;

    if( iBestStart>0 ){
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }

    /* Advance iterator ctx.iter so that it points to the first coalesced
    ** phrase instance at or following position iBestStart. */
    while( ctx.iter.iStart>=0 && ctx.iter.iStart<iBestStart && rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    if( ctx.iRangeEnd>=(nColSize-1) ){
      fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);
    }else{
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }
  }
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(aSeen);
  sqlite3_free(sFinder.aFirst);
}